

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O3

void xc_func_set_ext_params(xc_func_type *p,double *ext_params)

{
  xc_func_info_type *pxVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  
  pxVar1 = p->info;
  lVar2 = (long)(pxVar1->ext_params).n;
  if (lVar2 < 1) {
    pdVar3 = p->ext_params;
  }
  else {
    pdVar3 = p->ext_params;
    lVar4 = 0;
    do {
      dVar5 = ext_params[lVar4];
      if ((dVar5 == -999998888.0) && (!NAN(dVar5))) {
        dVar5 = (pxVar1->ext_params).values[lVar4];
      }
      pdVar3[lVar4] = dVar5;
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  (*(pxVar1->ext_params).set)(p,pdVar3);
  return;
}

Assistant:

void
xc_func_set_ext_params(xc_func_type *p, const double *ext_params)
{
  int ii;

  assert(p->info->ext_params.n > 0);
  /* We always store the current parameters in the functional instance */
  for(ii=0; ii<p->info->ext_params.n; ii++)
    p->ext_params[ii] = (ext_params[ii] == XC_EXT_PARAMS_DEFAULT) ? p->info->ext_params.values[ii] : ext_params[ii];
  /* Update the parameters */
  p->info->ext_params.set(p, p->ext_params);
}